

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O3

JavascriptFunction *
Js::StackScriptFunction::EnsureBoxed
          (JavascriptFunction *function,void *returnAddress,char16 *reason)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  StackScriptFunction *stackScriptFunction;
  FunctionProxy *pFVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  ParseableFunctionInfo *pPVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  char16_t *pcVar9;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  bVar2 = ThreadContext::IsOnStack(function);
  if (bVar2) {
    stackScriptFunction = VarTo<Js::StackScriptFunction,Js::JavascriptFunction>(function);
    if (stackScriptFunction->boxedScriptFunction != (ScriptFunction *)0x0) {
      return (JavascriptFunction *)stackScriptFunction->boxedScriptFunction;
    }
    unique0x10000309 = reason;
    pFVar4 = JavascriptFunction::GetFunctionProxy(function);
    sourceContextId = FunctionProxy::GetSourceContextId(pFVar4);
    pFVar4 = JavascriptFunction::GetFunctionProxy(function);
    pFVar6 = (pFVar4->functionInfo).ptr;
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00d4dd8e;
      *puVar5 = 0;
      pFVar6 = (pFVar4->functionInfo).ptr;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,sourceContextId,
                              pFVar6->functionId);
    if (bVar2) {
      pFVar4 = JavascriptFunction::GetFunctionProxy(function);
      pFVar6 = (pFVar4->functionInfo).ptr;
      if (pFVar6 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00d4dd8e;
        *puVar5 = 0;
        pFVar6 = (pFVar4->functionInfo).ptr;
      }
      if ((pFVar6->functionBodyImpl).ptr != pFVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) {
LAB_00d4dd8e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        pFVar6 = (pFVar4->functionInfo).ptr;
      }
      if ((pFVar6->attributes & DeferredDeserialize) == None) {
        pPVar7 = JavascriptFunction::GetParseableFunctionInfo(function);
        iVar3 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])(pPVar7);
        pcVar9 = (char16_t *)CONCAT44(extraout_var,iVar3);
      }
      else {
        pcVar9 = L"<DeferDeserialize>";
      }
      pFVar4 = JavascriptFunction::GetFunctionProxy(function);
      pcVar8 = FunctionProxy::GetDebugNumberSet(pFVar4,(wchar (*) [42])local_98);
      Output::Print(L"StackScriptFunction (%s): box and disable stack function: %s (function %s)\n",
                    stack0xffffffffffffffc0,pcVar9,pcVar8);
      Output::Flush();
    }
    function = (JavascriptFunction *)Box(stackScriptFunction,returnAddress);
  }
  return function;
}

Assistant:

JavascriptFunction *
    StackScriptFunction::EnsureBoxed(BOX_PARAM(JavascriptFunction * function, void * returnAddress, char16 const * reason))
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        if (!ThreadContext::IsOnStack(function))
        {
            return function;
        }

        // Only script function can be on the stack
        StackScriptFunction * stackScriptFunction = VarTo<StackScriptFunction>(function);
        ScriptFunction * boxedFunction = stackScriptFunction->boxedScriptFunction;
        if (boxedFunction != nullptr)
        {
            // We have already boxed this stack function before, and the function
            // wasn't on any slot or not a caller that we can replace.
            // Just give out the function we boxed before
            return boxedFunction;
        }

        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, function->GetFunctionProxy(),
            _u("StackScriptFunction (%s): box and disable stack function: %s (function %s)\n"),
            reason, function->GetFunctionProxy()->IsDeferredDeserializeFunction()?
            _u("<DeferDeserialize>") : function->GetParseableFunctionInfo()->GetDisplayName(),
            function->GetFunctionProxy()->GetDebugNumberSet(debugStringBuffer));

        // During the box workflow we reset all the parents of all nested functions and up. If a fault occurs when the stack function
        // is created this will cause further issues when trying to use the function object again. So failing faster seems to make more sense
        try
        {
           boxedFunction = StackScriptFunction::Box(stackScriptFunction, returnAddress);
        }
        catch (Js::OutOfMemoryException)
        {
           FailedToBox_OOM_unrecoverable_error((ULONG_PTR)stackScriptFunction);
        }
        return boxedFunction;
    }